

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::logger::reset_log_level(logger *this,char *module)

{
  unique_lock<std::mutex> *puVar1;
  unique_lock<std::mutex> *puVar2;
  undefined7 uVar3;
  int iVar4;
  char *in_RSI;
  unique_lock<std::mutex> *in_RDI;
  int i;
  unique_lock<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffc8;
  int local_24;
  
  hold_ptr<booster::log::logger::data>::operator->
            ((hold_ptr<booster::log::logger::data> *)(in_RDI + 0x401));
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  local_24 = 0;
  do {
    if (*(int *)&in_RDI[0x400]._M_owns <= local_24) {
LAB_00221163:
      std::unique_lock<std::mutex>::~unique_lock(in_RDI);
      return;
    }
    iVar4 = strcmp(*(char **)&in_RDI[local_24]._M_owns,in_RSI);
    if (iVar4 == 0) {
      puVar1 = in_RDI + (*(int *)&in_RDI[0x400]._M_owns + -1);
      puVar2 = in_RDI + local_24;
      uVar3 = *(undefined7 *)&puVar1->field_0x9;
      puVar2->_M_owns = puVar1->_M_owns;
      *(undefined7 *)&puVar2->field_0x9 = uVar3;
      *(undefined8 *)(&puVar2->_M_owns + 8) = *(undefined8 *)(&puVar1->_M_owns + 8);
      *(int *)&in_RDI[0x400]._M_owns = *(int *)&in_RDI[0x400]._M_owns + -1;
      *(undefined8 *)&in_RDI[*(int *)&in_RDI[0x400]._M_owns]._M_owns = 0;
      goto LAB_00221163;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void logger::reset_log_level(char const *module)
	{
		unique_lock<mutex> l(d->entries_lock);
		for(int i=0;i<entries_size_;i++) {
			if(strcmp(entries_[i].module,module)==0) {
				entries_[i]=entries_[entries_size_-1];
				entries_size_--;
				entries_[entries_size_].module = 0;
				return;
			}
		}
	}